

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void final_scene(int image_width,int samples_per_pixel,int max_depth)

{
  vec3 local_880;
  vec3 local_868;
  vec3 local_850;
  vec3 local_838;
  undefined1 local_820 [8];
  camera cam;
  undefined1 local_688 [16];
  undefined1 local_678 [32];
  shared_ptr<hittable> local_658;
  shared_ptr<lambertian> local_644;
  undefined1 local_628 [32];
  int local_608;
  int local_604;
  int j_1;
  int ns;
  undefined1 local_5e8 [8];
  shared_ptr<lambertian> white;
  hittable_list boxes2;
  undefined1 local_574 [28];
  undefined1 local_558 [32];
  undefined8 local_538;
  undefined1 local_530 [8];
  shared_ptr<noise_texture> pertext;
  undefined1 local_500 [32];
  shared_ptr<image_texture> local_4e0;
  undefined1 local_4d0 [8];
  shared_ptr<lambertian> emat;
  undefined1 local_4a8 [24];
  shared_ptr<hittable> local_490;
  undefined8 local_480;
  shared_ptr<dielectric> local_478;
  undefined1 local_464 [28];
  undefined1 local_448 [40];
  undefined1 local_420 [24];
  shared_ptr<hittable> local_408;
  shared_ptr<hittable> local_3f8;
  undefined8 local_3e8;
  shared_ptr<dielectric> local_3e0;
  undefined1 local_3cc [28];
  undefined1 local_3b0 [8];
  shared_ptr<sphere> boundary;
  vec3 local_398;
  undefined1 local_380 [24];
  vec3 local_368;
  undefined1 local_350 [32];
  undefined8 local_330;
  shared_ptr<dielectric> local_328;
  undefined1 local_314 [28];
  undefined1 local_2f8 [36];
  undefined1 local_2d4 [4];
  undefined1 local_2d0 [32];
  vec3 local_2b0;
  undefined1 local_298 [8];
  shared_ptr<lambertian> sphere_material;
  undefined1 local_270 [8];
  vec3 center2;
  point3 center1;
  vec3 local_228;
  vec3 local_210;
  undefined1 local_1f8 [32];
  vec3 local_1d8;
  undefined1 local_1c0 [8];
  shared_ptr<diffuse_light> light;
  shared_ptr<hittable> local_1a0;
  undefined1 local_190 [8];
  hittable_list world;
  vec3 local_130;
  vec3 local_118;
  undefined1 local_100 [32];
  double local_e0;
  double z1;
  double y1;
  double x1;
  double y0;
  double z0;
  double x0;
  double w;
  int j;
  int i;
  int boxes_per_side;
  vec3 local_90;
  undefined1 local_78 [8];
  shared_ptr<lambertian> ground;
  hittable_list boxes1;
  int max_depth_local;
  int samples_per_pixel_local;
  int image_width_local;
  
  hittable_list::hittable_list
            ((hittable_list *)
             &ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vec3::vec3(&local_90,0.48,0.83,0.53);
  std::make_shared<lambertian,vec3>((vec3 *)local_78);
  j = 0x14;
  for (w._4_4_ = 0; w._4_4_ < j; w._4_4_ = w._4_4_ + 1) {
    for (w._0_4_ = 0; w._0_4_ < j; w._0_4_ = w._0_4_ + 1) {
      x0 = 100.0;
      z0 = (double)w._4_4_ * 100.0 + -1000.0;
      y0 = (double)w._0_4_ * 100.0 + -1000.0;
      x1 = 0.0;
      y1 = z0 + 100.0;
      z1 = random_double(1.0,101.0);
      local_e0 = y0 + x0;
      vec3::vec3(&local_118,z0,x1,y0);
      vec3::vec3(&local_130,y1,z1,local_e0);
      std::shared_ptr<material>::shared_ptr<lambertian,void>
                ((shared_ptr<material> *)&world.bbox.z.max,(shared_ptr<lambertian> *)local_78);
      box((point3 *)local_100,&local_118,(shared_ptr<material> *)&local_130);
      std::shared_ptr<hittable>::shared_ptr<hittable_list,void>
                ((shared_ptr<hittable> *)(local_100 + 0x10),(shared_ptr<hittable_list> *)local_100);
      hittable_list::add((hittable_list *)
                         &ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(shared_ptr<hittable> *)(local_100 + 0x10));
      std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_100 + 0x10));
      std::shared_ptr<hittable_list>::~shared_ptr((shared_ptr<hittable_list> *)local_100);
      std::shared_ptr<material>::~shared_ptr((shared_ptr<material> *)&world.bbox.z.max);
    }
  }
  hittable_list::hittable_list((hittable_list *)local_190);
  std::make_shared<bvh_node,hittable_list&>
            ((hittable_list *)
             &light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<hittable>::shared_ptr<bvh_node,void>
            (&local_1a0,
             (shared_ptr<bvh_node> *)
             &light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  hittable_list::add((hittable_list *)local_190,&local_1a0);
  std::shared_ptr<hittable>::~shared_ptr(&local_1a0);
  std::shared_ptr<bvh_node>::~shared_ptr
            ((shared_ptr<bvh_node> *)
             &light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vec3::vec3(&local_1d8,7.0,7.0,7.0);
  std::make_shared<diffuse_light,vec3>((vec3 *)local_1c0);
  vec3::vec3(&local_210,123.0,554.0,147.0);
  vec3::vec3(&local_228,300.0,0.0,0.0);
  vec3::vec3((vec3 *)(center1.e + 2),0.0,0.0,265.0);
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<diffuse_light>&>
            ((vec3 *)local_1f8,&local_210,&local_228,(shared_ptr<diffuse_light> *)(center1.e + 2));
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_1f8 + 0x10),(shared_ptr<quad> *)local_1f8);
  hittable_list::add((hittable_list *)local_190,(shared_ptr<hittable> *)(local_1f8 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_1f8 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_1f8);
  vec3::vec3((vec3 *)(center2.e + 2),400.0,400.0,200.0);
  vec3::vec3((vec3 *)&sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,30.0,0.0,0.0);
  operator+((vec3 *)local_270,(vec3 *)(center2.e + 2),
            (vec3 *)&sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  vec3::vec3(&local_2b0,0.7,0.3,0.1);
  std::make_shared<lambertian,vec3>((vec3 *)local_298);
  local_2d4 = (undefined1  [4])0x32;
  std::make_shared<sphere,vec3&,vec3&,int,std::shared_ptr<lambertian>&>
            ((vec3 *)local_2d0,(vec3 *)(center2.e + 2),(int *)local_270,
             (shared_ptr<lambertian> *)local_2d4);
  std::shared_ptr<hittable>::shared_ptr<sphere,void>
            ((shared_ptr<hittable> *)(local_2d0 + 0x10),(shared_ptr<sphere> *)local_2d0);
  hittable_list::add((hittable_list *)local_190,(shared_ptr<hittable> *)(local_2d0 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_2d0 + 0x10));
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_2d0);
  vec3::vec3((vec3 *)(local_314 + 4),260.0,150.0,45.0);
  local_314._0_4_ = 0x32;
  local_330 = 0x3ff8000000000000;
  std::make_shared<dielectric,double>((double *)&local_328);
  std::make_shared<sphere,vec3,int,std::shared_ptr<dielectric>>
            ((vec3 *)local_2f8,(int *)(local_314 + 4),(shared_ptr<dielectric> *)local_314);
  std::shared_ptr<hittable>::shared_ptr<sphere,void>
            ((shared_ptr<hittable> *)(local_2f8 + 0x10),(shared_ptr<sphere> *)local_2f8);
  hittable_list::add((hittable_list *)local_190,(shared_ptr<hittable> *)(local_2f8 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_2f8 + 0x10));
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_2f8);
  std::shared_ptr<dielectric>::~shared_ptr(&local_328);
  vec3::vec3(&local_368,0.0,150.0,145.0);
  local_380._20_4_ = 0x32;
  vec3::vec3(&local_398,0.8,0.8,0.9);
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3ff0000000000000;
  std::make_shared<metal,vec3,double>((vec3 *)local_380,local_398.e);
  std::make_shared<sphere,vec3,int,std::shared_ptr<metal>>
            ((vec3 *)local_350,(int *)&local_368,(shared_ptr<metal> *)(local_380 + 0x14));
  std::shared_ptr<hittable>::shared_ptr<sphere,void>
            ((shared_ptr<hittable> *)(local_350 + 0x10),(shared_ptr<sphere> *)local_350);
  hittable_list::add((hittable_list *)local_190,(shared_ptr<hittable> *)(local_350 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_350 + 0x10));
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_350);
  std::shared_ptr<metal>::~shared_ptr((shared_ptr<metal> *)local_380);
  vec3::vec3((vec3 *)(local_3cc + 4),360.0,150.0,145.0);
  local_3cc._0_4_ = 0x46;
  local_3e8 = 0x3ff8000000000000;
  std::make_shared<dielectric,double>((double *)&local_3e0);
  std::make_shared<sphere,vec3,int,std::shared_ptr<dielectric>>
            ((vec3 *)local_3b0,(int *)(local_3cc + 4),(shared_ptr<dielectric> *)local_3cc);
  std::shared_ptr<dielectric>::~shared_ptr(&local_3e0);
  std::shared_ptr<hittable>::shared_ptr<sphere,void>(&local_3f8,(shared_ptr<sphere> *)local_3b0);
  hittable_list::add((hittable_list *)local_190,&local_3f8);
  std::shared_ptr<hittable>::~shared_ptr(&local_3f8);
  local_420._0_8_ = 0.2;
  vec3::vec3((vec3 *)(local_448 + 0x10),0.2,0.4,0.9);
  std::make_shared<constant_medium,std::shared_ptr<sphere>&,double,vec3>
            ((shared_ptr<sphere> *)(local_420 + 8),(double *)local_3b0,(vec3 *)local_420);
  std::shared_ptr<hittable>::shared_ptr<constant_medium,void>
            (&local_408,(shared_ptr<constant_medium> *)(local_420 + 8));
  hittable_list::add((hittable_list *)local_190,&local_408);
  std::shared_ptr<hittable>::~shared_ptr(&local_408);
  std::shared_ptr<constant_medium>::~shared_ptr((shared_ptr<constant_medium> *)(local_420 + 8));
  vec3::vec3((vec3 *)(local_464 + 4),0.0,0.0,0.0);
  local_464._0_4_ = 5000;
  local_480 = 0x3ff8000000000000;
  std::make_shared<dielectric,double>((double *)&local_478);
  std::make_shared<sphere,vec3,int,std::shared_ptr<dielectric>>
            ((vec3 *)local_448,(int *)(local_464 + 4),(shared_ptr<dielectric> *)local_464);
  std::shared_ptr<sphere>::operator=
            ((shared_ptr<sphere> *)local_3b0,(shared_ptr<sphere> *)local_448);
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_448);
  std::shared_ptr<dielectric>::~shared_ptr(&local_478);
  local_4a8._0_8_ = 0.0001;
  vec3::vec3((vec3 *)&emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             1.0,1.0,1.0);
  std::make_shared<constant_medium,std::shared_ptr<sphere>&,double,vec3>
            ((shared_ptr<sphere> *)(local_4a8 + 8),(double *)local_3b0,(vec3 *)local_4a8);
  std::shared_ptr<hittable>::shared_ptr<constant_medium,void>
            (&local_490,(shared_ptr<constant_medium> *)(local_4a8 + 8));
  hittable_list::add((hittable_list *)local_190,&local_490);
  std::shared_ptr<hittable>::~shared_ptr(&local_490);
  std::shared_ptr<constant_medium>::~shared_ptr((shared_ptr<constant_medium> *)(local_4a8 + 8));
  std::make_shared<image_texture,char_const(&)[13]>((char (*) [13])&local_4e0);
  std::make_shared<lambertian,std::shared_ptr<image_texture>>
            ((shared_ptr<image_texture> *)local_4d0);
  std::shared_ptr<image_texture>::~shared_ptr(&local_4e0);
  vec3::vec3((vec3 *)&stack0xfffffffffffffae8,400.0,200.0,400.0);
  pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       100;
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>&>
            ((vec3 *)local_500,(int *)&stack0xfffffffffffffae8,
             (shared_ptr<lambertian> *)
             ((long)&pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4));
  std::shared_ptr<hittable>::shared_ptr<sphere,void>
            ((shared_ptr<hittable> *)(local_500 + 0x10),(shared_ptr<sphere> *)local_500);
  hittable_list::add((hittable_list *)local_190,(shared_ptr<hittable> *)(local_500 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_500 + 0x10));
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_500);
  local_538 = 0x3fc999999999999a;
  std::make_shared<noise_texture,double>((double *)local_530);
  vec3::vec3((vec3 *)(local_574 + 4),220.0,280.0,300.0);
  local_574._0_4_ = 0x50;
  std::make_shared<lambertian,std::shared_ptr<noise_texture>&>
            ((shared_ptr<noise_texture> *)&boxes2.bbox.z.max);
  std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>>
            ((vec3 *)local_558,(int *)(local_574 + 4),(shared_ptr<lambertian> *)local_574);
  std::shared_ptr<hittable>::shared_ptr<sphere,void>
            ((shared_ptr<hittable> *)(local_558 + 0x10),(shared_ptr<sphere> *)local_558);
  hittable_list::add((hittable_list *)local_190,(shared_ptr<hittable> *)(local_558 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_558 + 0x10));
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_558);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)&boxes2.bbox.z.max);
  hittable_list::hittable_list
            ((hittable_list *)
             &white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vec3::vec3((vec3 *)&j_1,0.73,0.73,0.73);
  std::make_shared<lambertian,vec3>((vec3 *)local_5e8);
  local_604 = 1000;
  for (local_608 = 0; local_608 < local_604; local_608 = local_608 + 1) {
    vec3::random();
    local_644.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 10;
    std::make_shared<sphere,vec3,int,std::shared_ptr<lambertian>&>
              ((vec3 *)local_628,
               (int *)((long)&local_644.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 4),&local_644);
    std::shared_ptr<hittable>::shared_ptr<sphere,void>
              ((shared_ptr<hittable> *)(local_628 + 0x10),(shared_ptr<sphere> *)local_628);
    hittable_list::add((hittable_list *)
                       &white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ,(shared_ptr<hittable> *)(local_628 + 0x10));
    std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_628 + 0x10));
    std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_628);
  }
  std::make_shared<bvh_node,hittable_list&>((hittable_list *)local_688);
  std::make_shared<rotate_y,std::shared_ptr<bvh_node>,int>
            ((shared_ptr<bvh_node> *)local_678,(int *)local_688);
  vec3::vec3((vec3 *)(cam.defocus_disk_v.e + 2),-100.0,270.0,395.0);
  std::make_shared<translate,std::shared_ptr<rotate_y>,vec3>
            ((shared_ptr<rotate_y> *)(local_678 + 0x10),(vec3 *)local_678);
  std::shared_ptr<hittable>::shared_ptr<translate,void>
            (&local_658,(shared_ptr<translate> *)(local_678 + 0x10));
  hittable_list::add((hittable_list *)local_190,&local_658);
  std::shared_ptr<hittable>::~shared_ptr(&local_658);
  std::shared_ptr<translate>::~shared_ptr((shared_ptr<translate> *)(local_678 + 0x10));
  std::shared_ptr<rotate_y>::~shared_ptr((shared_ptr<rotate_y> *)local_678);
  std::shared_ptr<bvh_node>::~shared_ptr((shared_ptr<bvh_node> *)local_688);
  camera::camera((camera *)local_820);
  local_820 = (undefined1  [8])0x3ff0000000000000;
  cam.aspect_ratio._0_4_ = image_width;
  cam.aspect_ratio._4_4_ = samples_per_pixel;
  cam.image_width = max_depth;
  vec3::vec3(&local_838,0.0,0.0,0.0);
  cam.background.e[1] = local_838.e[2];
  cam._16_8_ = local_838.e[0];
  cam.background.e[0] = local_838.e[1];
  cam.background.e[2] = 40.0;
  vec3::vec3(&local_850,478.0,278.0,-600.0);
  cam.lookfrom.e[1] = local_850.e[2];
  cam.vfov = local_850.e[0];
  cam.lookfrom.e[0] = local_850.e[1];
  vec3::vec3(&local_868,278.0,278.0,0.0);
  cam.lookat.e[1] = local_868.e[2];
  cam.lookfrom.e[2] = local_868.e[0];
  cam.lookat.e[0] = local_868.e[1];
  vec3::vec3(&local_880,0.0,1.0,0.0);
  cam.vup.e[1] = local_880.e[2];
  cam.lookat.e[2] = local_880.e[0];
  cam.vup.e[0] = local_880.e[1];
  cam.vup.e[2] = 0.0;
  camera::render((camera *)local_820,(hittable *)local_190);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)local_5e8);
  hittable_list::~hittable_list
            ((hittable_list *)
             &white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<noise_texture>::~shared_ptr((shared_ptr<noise_texture> *)local_530);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)local_4d0);
  std::shared_ptr<sphere>::~shared_ptr((shared_ptr<sphere> *)local_3b0);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)local_298);
  std::shared_ptr<diffuse_light>::~shared_ptr((shared_ptr<diffuse_light> *)local_1c0);
  hittable_list::~hittable_list((hittable_list *)local_190);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)local_78);
  hittable_list::~hittable_list
            ((hittable_list *)
             &ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void final_scene(int image_width, int samples_per_pixel, int max_depth) {
    hittable_list boxes1;
    auto ground = make_shared<lambertian>(color(0.48, 0.83, 0.53));

    int boxes_per_side = 20;
    for (int i = 0; i < boxes_per_side; i++) {
        for (int j = 0; j < boxes_per_side; j++) {
            auto w = 100.0;
            auto x0 = -1000.0 + i*w;
            auto z0 = -1000.0 + j*w;
            auto y0 = 0.0;
            auto x1 = x0 + w;
            auto y1 = random_double(1,101);
            auto z1 = z0 + w;

            boxes1.add(box(point3(x0,y0,z0), point3(x1,y1,z1), ground));
        }
    }

    hittable_list world;

    world.add(make_shared<bvh_node>(boxes1));

    auto light = make_shared<diffuse_light>(color(7, 7, 7));
    world.add(make_shared<quad>(point3(123,554,147), vec3(300,0,0), vec3(0,0,265), light));

    auto center1 = point3(400, 400, 200);
    auto center2 = center1 + vec3(30,0,0);
    auto sphere_material = make_shared<lambertian>(color(0.7, 0.3, 0.1));
    world.add(make_shared<sphere>(center1, center2, 50, sphere_material));

    world.add(make_shared<sphere>(point3(260, 150, 45), 50, make_shared<dielectric>(1.5)));
    world.add(make_shared<sphere>(
        point3(0, 150, 145), 50, make_shared<metal>(color(0.8, 0.8, 0.9), 1.0)
    ));

    auto boundary = make_shared<sphere>(point3(360,150,145), 70, make_shared<dielectric>(1.5));
    world.add(boundary);
    world.add(make_shared<constant_medium>(boundary, 0.2, color(0.2, 0.4, 0.9)));
    boundary = make_shared<sphere>(point3(0,0,0), 5000, make_shared<dielectric>(1.5));
    world.add(make_shared<constant_medium>(boundary, .0001, color(1,1,1)));

    auto emat = make_shared<lambertian>(make_shared<image_texture>("earthmap.jpg"));
    world.add(make_shared<sphere>(point3(400,200,400), 100, emat));
    auto pertext = make_shared<noise_texture>(0.2);
    world.add(make_shared<sphere>(point3(220,280,300), 80, make_shared<lambertian>(pertext)));

    hittable_list boxes2;
    auto white = make_shared<lambertian>(color(.73, .73, .73));
    int ns = 1000;
    for (int j = 0; j < ns; j++) {
        boxes2.add(make_shared<sphere>(point3::random(0,165), 10, white));
    }

    world.add(make_shared<translate>(
        make_shared<rotate_y>(
            make_shared<bvh_node>(boxes2), 15),
            vec3(-100,270,395)
        )
    );

    camera cam;

    cam.aspect_ratio      = 1.0;
    cam.image_width       = image_width;
    cam.samples_per_pixel = samples_per_pixel;
    cam.max_depth         = max_depth;
    cam.background        = color(0,0,0);

    cam.vfov     = 40;
    cam.lookfrom = point3(478, 278, -600);
    cam.lookat   = point3(278, 278, 0);
    cam.vup      = vec3(0,1,0);

    cam.defocus_angle = 0;

    cam.render(world);
}